

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_ldrddi.cpp
# Opt level: O2

ze_result_t
loader::zeDeviceGetFabricVertexExp(ze_device_handle_t hDevice,ze_fabric_vertex_handle_t *phVertex)

{
  ze_pfnDeviceGetFabricVertexExp_t p_Var1;
  ze_result_t zVar2;
  object_t<_ze_fabric_vertex_handle_t_*> *poVar3;
  dditable_t *dditable;
  dditable_t *local_10;
  
  local_10 = *(dditable_t **)(hDevice + 8);
  p_Var1 = (local_10->ze).DeviceExp.pfnGetFabricVertexExp;
  if (p_Var1 == (ze_pfnDeviceGetFabricVertexExp_t)0x0) {
    zVar2 = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    zVar2 = (*p_Var1)(*(ze_device_handle_t *)hDevice,phVertex);
    if (zVar2 == ZE_RESULT_SUCCESS) {
      poVar3 = singleton_factory_t<object_t<_ze_fabric_vertex_handle_t*>,_ze_fabric_vertex_handle_t*>
               ::getInstance<_ze_fabric_vertex_handle_t*&,dditable_t*&>
                         ((singleton_factory_t<object_t<_ze_fabric_vertex_handle_t*>,_ze_fabric_vertex_handle_t*>
                           *)(context + 0x360),phVertex,&local_10);
      *phVertex = (ze_fabric_vertex_handle_t)poVar3;
      zVar2 = ZE_RESULT_SUCCESS;
    }
  }
  return zVar2;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeDeviceGetFabricVertexExp(
        ze_device_handle_t hDevice,                     ///< [in] handle of the device
        ze_fabric_vertex_handle_t* phVertex             ///< [out] fabric vertex handle corresponding to device
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<ze_device_object_t*>( hDevice )->dditable;
        auto pfnGetFabricVertexExp = dditable->ze.DeviceExp.pfnGetFabricVertexExp;
        if( nullptr == pfnGetFabricVertexExp )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hDevice = reinterpret_cast<ze_device_object_t*>( hDevice )->handle;

        // forward to device-driver
        result = pfnGetFabricVertexExp( hDevice, phVertex );

        if( ZE_RESULT_SUCCESS != result )
            return result;

        try
        {
            // convert driver handle to loader handle
            *phVertex = reinterpret_cast<ze_fabric_vertex_handle_t>(
                context->ze_fabric_vertex_factory.getInstance( *phVertex, dditable ) );
        }
        catch( std::bad_alloc& )
        {
            result = ZE_RESULT_ERROR_OUT_OF_HOST_MEMORY;
        }

        return result;
    }